

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTreeErrorReporter.cpp
# Opt level: O2

void __thiscall
DOMTreeErrorReporter::fatalError(DOMTreeErrorReporter *this,SAXParseException *toCatch)

{
  ostream *poVar1;
  XMLCh *pXVar2;
  StrX local_28;
  StrX local_20;
  
  this->fSawErrors = true;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Fatal Error at file \"");
  pXVar2 = (XMLCh *)xercesc_4_0::SAXParseException::getSystemId();
  StrX::StrX(&local_20,pXVar2);
  std::operator<<(poVar1,local_20.fLocalForm);
  poVar1 = std::operator<<(poVar1,"\", line ");
  xercesc_4_0::SAXParseException::getLineNumber();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", column ");
  xercesc_4_0::SAXParseException::getColumnNumber();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n   Message: ");
  pXVar2 = (XMLCh *)(**(code **)(*(long *)toCatch + 0x10))(toCatch);
  StrX::StrX(&local_28,pXVar2);
  std::operator<<(poVar1,local_28.fLocalForm);
  std::endl<char,std::char_traits<char>>(poVar1);
  StrX::~StrX(&local_28);
  StrX::~StrX(&local_20);
  return;
}

Assistant:

void DOMTreeErrorReporter::fatalError(const SAXParseException& toCatch)
{
    fSawErrors = true;
    std::cerr << "Fatal Error at file \"" << StrX(toCatch.getSystemId())
		 << "\", line " << toCatch.getLineNumber()
		 << ", column " << toCatch.getColumnNumber()
         << "\n   Message: " << StrX(toCatch.getMessage()) << std::endl;
}